

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteObjectRuleFiles
          (cmMakefileTargetGenerator *this,cmSourceFile *source)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  ostream *poVar4;
  undefined1 local_300 [8];
  string srcFullPath;
  undefined1 local_2c0 [8];
  string objFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_278;
  undefined1 local_258 [8];
  string dir;
  undefined1 local_218 [8];
  ostringstream err;
  _Self local_90;
  _Self local_88;
  undefined1 local_80 [8];
  string obj;
  string *objectName;
  string local_40;
  string *local_20;
  string *lang;
  cmSourceFile *source_local;
  cmMakefileTargetGenerator *this_local;
  
  lang = (string *)source;
  source_local = (cmSourceFile *)this;
  cmLocalGenerator::GetSourceFileLanguage_abi_cxx11_
            (&local_40,(cmLocalGenerator *)this->LocalGenerator,source);
  local_20 = &local_40;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,(cmSourceFile *)lang);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[0xc])
              (local_80,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::__cxx11::string::operator+=((string *)local_80,"/");
    std::__cxx11::string::operator+=((string *)local_80,(string *)psVar3);
    local_88._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->ObjectFiles,(key_type *)local_80);
    local_90._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->ObjectFiles);
    bVar1 = std::operator==(&local_88,&local_90);
    if (bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->ObjectFiles,(value_type *)local_80);
      cmsys::SystemTools::GetFilenamePath((string *)local_258,(string *)local_80);
      cmLocalUnixMakefileGenerator3::ConvertToFullPath
                (&local_278,this->LocalGenerator,(string *)local_258);
      cmsys::SystemTools::MakeDirectory(&local_278,(mode_t *)0x0);
      std::__cxx11::string::~string((string *)&local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Objects,(value_type *)local_80);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->CleanFiles,(value_type *)local_80);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&objFullPath.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      WriteObjectBuildFile(this,(string *)local_80,local_20,(cmSourceFile *)lang,this_00);
      psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         ((cmLocalGenerator *)this->LocalGenerator);
      std::__cxx11::string::string((string *)local_2c0,(string *)psVar3);
      std::__cxx11::string::operator+=((string *)local_2c0,"/");
      std::__cxx11::string::operator+=((string *)local_2c0,(string *)local_80);
      cmsys::SystemTools::CollapseFullPath
                ((string *)((long)&srcFullPath.field_2 + 8),(string *)local_2c0);
      std::__cxx11::string::operator=
                ((string *)local_2c0,(string *)(srcFullPath.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(srcFullPath.field_2._M_local_buf + 8));
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)lang);
      cmsys::SystemTools::CollapseFullPath((string *)local_300,psVar3);
      cmLocalUnixMakefileGenerator3::AddImplicitDepends
                (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,local_20
                 ,(string *)local_2c0,(string *)local_300);
      std::__cxx11::string::~string((string *)local_300);
      std::__cxx11::string::~string((string *)local_2c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&objFullPath.field_2 + 8));
      std::__cxx11::string::~string((string *)local_258);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      poVar4 = std::operator<<((ostream *)local_218,"Warning: Source file \"");
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)lang);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      poVar4 = std::operator<<(poVar4,"\" is listed multiple times for target \"");
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Message((string *)((long)&dir.field_2 + 8),"Warning");
      std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectRuleFiles(
  cmSourceFile const& source)
{
  // Identify the language of the source file.
  const std::string& lang =
    this->LocalGenerator->GetSourceFileLanguage(source);
  if (lang.empty()) {
    // don't know anything about this file so skip it
    return;
  }

  // Get the full path name of the object file.
  std::string const& objectName =
    this->GeneratorTarget->GetObjectName(&source);
  std::string obj =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  obj += "/";
  obj += objectName;

  // Avoid generating duplicate rules.
  if (this->ObjectFiles.find(obj) == this->ObjectFiles.end()) {
    this->ObjectFiles.insert(obj);
  } else {
    std::ostringstream err;
    err << "Warning: Source file \"" << source.GetFullPath()
        << "\" is listed multiple times for target \""
        << this->GeneratorTarget->GetName() << "\".";
    cmSystemTools::Message(err.str(), "Warning");
    return;
  }

  // Create the directory containing the object file.  This may be a
  // subdirectory under the target's directory.
  std::string dir = cmSystemTools::GetFilenamePath(obj);
  cmSystemTools::MakeDirectory(this->LocalGenerator->ConvertToFullPath(dir));

  // Save this in the target's list of object files.
  this->Objects.push_back(obj);
  this->CleanFiles.insert(obj);

  // TODO: Remove
  // std::string relativeObj
  //= this->LocalGenerator->GetHomeRelativeOutputPath();
  // relativeObj += obj;

  // we compute some depends when writing the depend.make that we will also
  // use in the build.make, same with depMakeFile
  std::vector<std::string> depends;

  // generate the build rule file
  this->WriteObjectBuildFile(obj, lang, source, depends);

  // The object file should be checked for dependency integrity.
  std::string objFullPath = this->LocalGenerator->GetCurrentBinaryDirectory();
  objFullPath += "/";
  objFullPath += obj;
  objFullPath = cmSystemTools::CollapseFullPath(objFullPath);
  std::string srcFullPath =
    cmSystemTools::CollapseFullPath(source.GetFullPath());
  this->LocalGenerator->AddImplicitDepends(this->GeneratorTarget, lang,
                                           objFullPath, srcFullPath);
}